

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.hh
# Opt level: O1

void __thiscall Varnode::copySymbolIfValid(Varnode *this,Varnode *vn)

{
  uint4 *puVar1;
  SymbolEntry *pSVar2;
  bool bVar3;
  uint uVar4;
  EquateSymbol *this_00;
  undefined8 in_R8;
  undefined8 in_R9;
  
  pSVar2 = vn->mapentry;
  if (pSVar2 != (SymbolEntry *)0x0) {
    if (pSVar2->symbol == (Symbol *)0x0) {
      this_00 = (EquateSymbol *)0x0;
    }
    else {
      this_00 = (EquateSymbol *)
                __dynamic_cast(pSVar2->symbol,&Symbol::typeinfo,&EquateSymbol::typeinfo,0,in_R8,
                               in_R9,pSVar2);
    }
    if ((this_00 != (EquateSymbol *)0x0) &&
       (bVar3 = EquateSymbol::isValueClose(this_00,(this->loc).offset,this->size), bVar3)) {
      this->type = vn->type;
      this->mapentry = vn->mapentry;
      uVar4 = this->flags & 0xfffffcff;
      this->flags = uVar4;
      this->flags = vn->flags & 0x300 | uVar4;
      if (this->high != (HighVariable *)0x0) {
        puVar1 = &this->high->highflags;
        *(byte *)puVar1 = (byte)*puVar1 | 2;
      }
    }
  }
  return;
}

Assistant:

SymbolEntry *getSymbolEntry(void) const { return mapentry; }